

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O0

void set_hduname(int hdunum,int hdutype,char *extname,int extver)

{
  int iVar1;
  int i;
  int extver_local;
  char *extname_local;
  int hdutype_local;
  int hdunum_local;
  
  iVar1 = hdunum + -1;
  hduname[iVar1]->hdutype = hdutype;
  if (extname == (char *)0x0) {
    strcpy(hduname[iVar1]->extname,"");
  }
  else {
    strcpy(hduname[iVar1]->extname,extname);
  }
  hduname[iVar1]->extver = extver;
  return;
}

Assistant:

void set_hduname(  int hdunum,		/* hdu number */ 
		   int hdutype,		/* hdutype */
		   char* extname,	/* extension name */
                   int  extver 		/* extension version */
                )
{
    int i; 
    i = hdunum - 1;
    hduname[i]->hdutype = hdutype;
    if(extname!=NULL)
        strcpy (hduname[i]->extname,extname); 
    else 
        strcpy(hduname[i]->extname,"");
    hduname[i]->extver = extver;
    return;
}